

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_JSON.h
# Opt level: O2

string * __thiscall
choc::json::getEscapedQuotedString_abi_cxx11_
          (string *__return_storage_ptr__,json *this,string_view s)

{
  allocator<char> local_1b9;
  string_view s_local;
  UTF8Pointer local_1a8;
  ostringstream result;
  
  s_local._M_str = (char *)s._M_len;
  s_local._M_len = (size_t)this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
  std::operator<<((ostream *)&result,'\"');
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_1a8,&s_local,&local_1b9);
  writeWithEscapeCharacters<std::__cxx11::ostringstream>(&result,local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::operator<<((ostream *)&result,'\"');
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
  return __return_storage_ptr__;
}

Assistant:

inline std::string getEscapedQuotedString (std::string_view s)
{
    std::ostringstream result;
    result << '"';
    writeWithEscapeCharacters (result, text::UTF8Pointer (std::string (s).c_str()));
    result << '"';
    return result.str();
}